

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.h
# Opt level: O1

uint8_t * quicly_encode_max_data_frame(uint8_t *dst,uint64_t max_data)

{
  uint8_t *in_RAX;
  uint8_t *puVar1;
  
  *dst = '\x10';
  puVar1 = dst + 1;
  if (0x3f < max_data) {
    if (max_data < 0x4000) {
      dst[1] = (byte)(max_data >> 8) | 0x40;
      puVar1 = dst + 2;
    }
    else {
      quicly_encode_max_data_frame_cold_1();
      puVar1 = in_RAX;
    }
  }
  *puVar1 = (uint8_t)max_data;
  return puVar1 + 1;
}

Assistant:

inline uint8_t *quicly_encode_max_data_frame(uint8_t *dst, uint64_t max_data)
{
    *dst++ = QUICLY_FRAME_TYPE_MAX_DATA;
    dst = quicly_encodev(dst, max_data);
    return dst;
}